

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int JS_PreventExtensions(JSContext *ctx,JSValue obj)

{
  byte *pbVar1;
  JSValueUnion JVar2;
  int iVar3;
  uint uVar4;
  JSValueUnion *argv;
  JSValue obj_00;
  JSValue JVar5;
  JSValueUnion JStack_30;
  int64_t iStack_28;
  
  if ((int)obj.tag != -1) {
    return 0;
  }
  if (*(short *)((long)obj.u.ptr + 6) != 0x29) {
    pbVar1 = (byte *)((long)obj.u.ptr + 5);
    *pbVar1 = *pbVar1 & 0xfe;
    return 1;
  }
  argv = (JSValueUnion *)get_proxy_method(ctx,(JSValue *)&JStack_30,obj,0x62);
  if (argv != (JSValueUnion *)0x0) {
    if ((int)iStack_28 == 3) {
      iVar3 = JS_PreventExtensions(ctx,*(JSValue *)argv);
      return iVar3;
    }
    JVar5.tag = iStack_28;
    JVar5.u.float64 = JStack_30.float64;
    JVar5 = JS_CallFree(ctx,JVar5,*(JSValue *)(argv + 2),1,(JSValue *)argv);
    if ((int)JVar5.tag != 6) {
      iVar3 = JS_ToBoolFree(ctx,JVar5);
      if (iVar3 == 0) {
        return 0;
      }
      if (argv[1].int32 != -1) {
        return iVar3;
      }
      JVar2 = (JSValueUnion)argv->ptr;
      if (*(short *)((long)JVar2.ptr + 6) == 0x29) {
        obj_00.tag = (int64_t)argv[1].ptr;
        obj_00.u = (JSValueUnion)(JSValueUnion)JVar2.ptr;
        uVar4 = js_proxy_isExtensible(ctx,obj_00);
        if ((int)uVar4 < 0) {
          return -1;
        }
      }
      else {
        uVar4 = *(byte *)((long)JVar2.ptr + 5) & 1;
      }
      if (uVar4 == 0) {
        return iVar3;
      }
      JS_ThrowTypeError(ctx,"proxy: inconsistent preventExtensions");
    }
  }
  return -1;
}

Assistant:

int JS_PreventExtensions(JSContext *ctx, JSValueConst obj)
{
    JSObject *p;

    if (unlikely(JS_VALUE_GET_TAG(obj) != JS_TAG_OBJECT))
        return FALSE;
    p = JS_VALUE_GET_OBJ(obj);
    if (unlikely(p->class_id == JS_CLASS_PROXY))
        return js_proxy_preventExtensions(ctx, obj);
    p->extensible = FALSE;
    return TRUE;
}